

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_0::AccessorVerifier::SetTracker
          (AccessorVerifier *this,bool *v,byte new_value)

{
  bool *v1;
  bool *v2;
  char *failure_msg;
  LogMessage *pLVar1;
  string local_68;
  LogMessage local_48;
  Voidify local_31;
  Nullable<const_char_*> local_30;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  bool *pbStack_20;
  bool new_value_local;
  bool *v_local;
  AccessorVerifier *this_local;
  
  absl_log_internal_check_op_result._7_1_ = new_value & 1;
  pbStack_20 = v;
  v_local = &this->needs_annotate_;
  v1 = absl::lts_20250127::log_internal::GetReferenceableValue<bool>(v);
  v2 = absl::lts_20250127::log_internal::GetReferenceableValue<bool>
                 ((bool *)((long)&absl_log_internal_check_op_result + 7));
  local_30 = absl::lts_20250127::log_internal::Check_NEImpl<bool,bool>(v1,v2,"v != new_value");
  if (local_30 != (Nullable<const_char_*>)0x0) {
    failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_30);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_48,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/message.cc"
               ,0x4f9,failure_msg);
    pLVar1 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_48);
    cpp::(anonymous_namespace)::AccessorVerifier::Error_abi_cxx11_(&local_68,this);
    pLVar1 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar1,&local_68);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_31,pLVar1);
    std::__cxx11::string::~string((string *)&local_68);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_48);
  }
  *pbStack_20 = (bool)(absl_log_internal_check_op_result._7_1_ & 1);
  return;
}

Assistant:

void SetTracker(bool& v, bool new_value, SourceLocation loc) {
    ABSL_CHECK_NE(v, new_value) << Error(loc);
    v = new_value;
  }